

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_comparison_unit.c
# Opt level: O0

int main(void)

{
  int iVar1;
  CMUnitTest tests [17];
  undefined1 auStackY_2b8 [128];
  CMFixtureFunction in_stack_fffffffffffffdc8;
  CMFixtureFunction in_stack_fffffffffffffdd0;
  size_t in_stack_fffffffffffffdd8;
  CMUnitTest *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  
  tellmeall();
  memcpy(auStackY_2b8,&PTR_anon_var_dwarf_72_00181b30,0x2a8);
  iVar1 = _cmocka_run_group_tests
                    (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                     in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  return iVar1;
}

Assistant:

int main() {
    tellmeall();
    const struct CMUnitTest tests[] = {
        cmocka_unit_test(equal_array_array_test),
        cmocka_unit_test(equal_bitset_bitset_test),
        cmocka_unit_test(equal_run_run_test),
        cmocka_unit_test(equal_array_bitset_test),
        cmocka_unit_test(equal_bitset_array_test),
        cmocka_unit_test(equal_array_run_test),
        cmocka_unit_test(equal_run_array_test),
        cmocka_unit_test(equal_bitset_run_test),
        cmocka_unit_test(equal_run_bitset_test),
        cmocka_unit_test(subset_array_array_test),
        cmocka_unit_test(subset_bitset_bitset_test),
        cmocka_unit_test(subset_run_run_test),
        cmocka_unit_test(subset_array_bitset_test),
        cmocka_unit_test(subset_array_run_test),
        cmocka_unit_test(subset_run_array_test),
        cmocka_unit_test(subset_bitset_run_test),
        cmocka_unit_test(subset_run_bitset_test),
    };

    return cmocka_run_group_tests(tests, NULL, NULL);
}